

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_3b25::test7(void)

{
  int in_stack_00000074;
  
  testThrowErrnoExc<Iex_3_4::EpermExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnoentExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EsrchExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EintrExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EioExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnxioExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::E2bigExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnoexecExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadfExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EchildExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EagainExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnomemExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EaccesExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EfaultExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotblkExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbusyExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EexistExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ExdevExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnodevExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotdirExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EisdirExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EinvalExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnfileExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EmfileExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnottyExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EtxtbsyExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EfbigExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnospcExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EspipeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ErofsExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EmlinkExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EpipeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EdomExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ErangeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnomsgExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EidrmExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EchrngExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::El2nsyncExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::El3hltExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::El3rstExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElnrngExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EunatchExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnocsiExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::El2hltExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EdeadlkExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnolckExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadrExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ExfullExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnoanoExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadrqcExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadsltExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbfontExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnostrExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnodataExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EtimeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnosrExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnonetExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnopkgExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EremoteExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnolinkExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EadvExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EsrmntExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EcommExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EprotoExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EmultihopExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadmsgExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnametoolongExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EoverflowExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotuniqExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EbadfdExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EremchgExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElibaccExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElibbadExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElibscnExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElibmaxExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ElibexecExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EilseqExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnosysExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EloopExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::ErestartExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EstrpipeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotemptyExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EusersExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotsockExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EdestaddrreqExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EmsgsizeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EprototypeExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnoprotooptExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EprotonosupportExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EsocktnosupportExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EopnotsuppExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EpfnosupportExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EafnosupportExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EaddrinuseExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EaddrnotavailExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnetdownExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnetunreachExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnetresetExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EconnabortedExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EconnresetExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnobufsExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EisconnExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotconnExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EshutdownExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EtoomanyrefsExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EtimedoutExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EconnrefusedExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EhostdownExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EhostunreachExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EalreadyExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EinprogressExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EstaleExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EucleanExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnotnamExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EnavailExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EisnamExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EremoteioExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EcanceledExc>(in_stack_00000074);
  testThrowErrnoExc<Iex_3_4::EdquotExc>(in_stack_00000074);
  return;
}

Assistant:

void
test7 ()
{
#if defined(EPERM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EpermExc> (EPERM);
#endif
#if defined(ENOENT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoentExc> (ENOENT);
#endif
#if defined(ESRCH)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EsrchExc> (ESRCH);
#endif
#if defined(EINTR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EintrExc> (EINTR);
#endif
#if defined(EIO)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EioExc> (EIO);
#endif
#if defined(ENXIO)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnxioExc> (ENXIO);
#endif
#if defined(E2BIG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::E2bigExc> (E2BIG);
#endif
#if defined(ENOEXEC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoexecExc> (ENOEXEC);
#endif
#if defined(EBADF)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadfExc> (EBADF);
#endif
#if defined(ECHILD)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EchildExc> (ECHILD);
#endif
#if defined(EAGAIN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EagainExc> (EAGAIN);
#endif
#if defined(ENOMEM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnomemExc> (ENOMEM);
#endif
#if defined(EACCES)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EaccesExc> (EACCES);
#endif
#if defined(EFAULT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EfaultExc> (EFAULT);
#endif
#if defined(ENOTBLK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotblkExc> (ENOTBLK);
#endif
#if defined(EBUSY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbusyExc> (EBUSY);
#endif
#if defined(EEXIST)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EexistExc> (EEXIST);
#endif
#if defined(EXDEV)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ExdevExc> (EXDEV);
#endif
#if defined(ENODEV)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnodevExc> (ENODEV);
#endif
#if defined(ENOTDIR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotdirExc> (ENOTDIR);
#endif
#if defined(EISDIR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EisdirExc> (EISDIR);
#endif
#if defined(EINVAL)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinvalExc> (EINVAL);
#endif
#if defined(ENFILE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnfileExc> (ENFILE);
#endif
#if defined(EMFILE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EmfileExc> (EMFILE);
#endif
#if defined(ENOTTY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnottyExc> (ENOTTY);
#endif
#if defined(ETXTBSY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EtxtbsyExc> (ETXTBSY);
#endif
#if defined(EFBIG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EfbigExc> (EFBIG);
#endif
#if defined(ENOSPC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnospcExc> (ENOSPC);
#endif
#if defined(ESPIPE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EspipeExc> (ESPIPE);
#endif
#if defined(EROFS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ErofsExc> (EROFS);
#endif
#if defined(EMLINK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EmlinkExc> (EMLINK);
#endif
#if defined(EPIPE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EpipeExc> (EPIPE);
#endif
#if defined(EDOM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdomExc> (EDOM);
#endif
#if defined(ERANGE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ErangeExc> (ERANGE);
#endif
#if defined(ENOMSG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnomsgExc> (ENOMSG);
#endif
#if defined(EIDRM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EidrmExc> (EIDRM);
#endif
#if defined(ECHRNG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EchrngExc> (ECHRNG);
#endif
#if defined(EL2NSYNC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::El2nsyncExc> (EL2NSYNC);
#endif
#if defined(EL3HLT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::El3hltExc> (EL3HLT);
#endif
#if defined(EL3RST)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::El3rstExc> (EL3RST);
#endif
#if defined(ELNRNG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElnrngExc> (ELNRNG);
#endif
#if defined(EUNATCH)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EunatchExc> (EUNATCH);
#endif
#if defined(ENOCSI)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnocsiExc> (ENOCSI);
#endif
#if defined(EL2HLT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::El2hltExc> (EL2HLT);
#endif
#if defined(EDEADLK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdeadlkExc> (EDEADLK);
#endif
#if defined(ENOLCK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnolckExc> (ENOLCK);
#endif
#if defined(EBADE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadeExc> (EBADE);
#endif
#if defined(EBADR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadrExc> (EBADR);
#endif
#if defined(EXFULL)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ExfullExc> (EXFULL);
#endif
#if defined(ENOANO)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoanoExc> (ENOANO);
#endif
#if defined(EBADRQC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadrqcExc> (EBADRQC);
#endif
#if defined(EBADSLT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadsltExc> (EBADSLT);
#endif
#if defined(EDEADLOCK) && defined(EDEADLK)
#    if EDEADLOCK != EDEADLK
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdeadlockExc> (EDEADLOCK);
#    endif
#elif defined(EDEADLOCK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdeadlockExc> (EDEADLOCK);
#endif
#if defined(EBFONT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbfontExc> (EBFONT);
#endif
#if defined(ENOSTR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnostrExc> (ENOSTR);
#endif
#if defined(ENODATA)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnodataExc> (ENODATA);
#endif
#if defined(ETIME)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EtimeExc> (ETIME);
#endif
#if defined(ENOSR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnosrExc> (ENOSR);
#endif
#if defined(ENONET)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnonetExc> (ENONET);
#endif
#if defined(ENOPKG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnopkgExc> (ENOPKG);
#endif
#if defined(EREMOTE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EremoteExc> (EREMOTE);
#endif
#if defined(ENOLINK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnolinkExc> (ENOLINK);
#endif
#if defined(EADV)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EadvExc> (EADV);
#endif
#if defined(ESRMNT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EsrmntExc> (ESRMNT);
#endif
#if defined(ECOMM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EcommExc> (ECOMM);
#endif
#if defined(EPROTO)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EprotoExc> (EPROTO);
#endif
#if defined(EMULTIHOP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EmultihopExc> (EMULTIHOP);
#endif
#if defined(EBADMSG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadmsgExc> (EBADMSG);
#endif
#if defined(ENAMETOOLONG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnametoolongExc> (ENAMETOOLONG);
#endif
#if defined(EOVERFLOW)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EoverflowExc> (EOVERFLOW);
#endif
#if defined(ENOTUNIQ)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotuniqExc> (ENOTUNIQ);
#endif
#if defined(EBADFD)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbadfdExc> (EBADFD);
#endif
#if defined(EREMCHG)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EremchgExc> (EREMCHG);
#endif
#if defined(ELIBACC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElibaccExc> (ELIBACC);
#endif
#if defined(ELIBBAD)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElibbadExc> (ELIBBAD);
#endif
#if defined(ELIBSCN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElibscnExc> (ELIBSCN);
#endif
#if defined(ELIBMAX)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElibmaxExc> (ELIBMAX);
#endif
#if defined(ELIBEXEC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ElibexecExc> (ELIBEXEC);
#endif
#if defined(EILSEQ)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EilseqExc> (EILSEQ);
#endif
#if defined(ENOSYS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnosysExc> (ENOSYS);
#endif
#if defined(ELOOP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EloopExc> (ELOOP);
#endif
#if defined(ERESTART)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::ErestartExc> (ERESTART);
#endif
#if defined(ESTRPIPE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EstrpipeExc> (ESTRPIPE);
#endif
#if defined(ENOTEMPTY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotemptyExc> (ENOTEMPTY);
#endif
#if defined(EUSERS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EusersExc> (EUSERS);
#endif
#if defined(ENOTSOCK)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotsockExc> (ENOTSOCK);
#endif
#if defined(EDESTADDRREQ)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdestaddrreqExc> (EDESTADDRREQ);
#endif
#if defined(EMSGSIZE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EmsgsizeExc> (EMSGSIZE);
#endif
#if defined(EPROTOTYPE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EprototypeExc> (EPROTOTYPE);
#endif
#if defined(ENOPROTOOPT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoprotooptExc> (ENOPROTOOPT);
#endif
#if defined(EPROTONOSUPPORT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EprotonosupportExc> (
        EPROTONOSUPPORT);
#endif
#if defined(ESOCKTNOSUPPORT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EsocktnosupportExc> (
        ESOCKTNOSUPPORT);
#endif
#if defined(EOPNOTSUPP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EopnotsuppExc> (EOPNOTSUPP);
#endif
#if defined(EPFNOSUPPORT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EpfnosupportExc> (EPFNOSUPPORT);
#endif
#if defined(EAFNOSUPPORT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EafnosupportExc> (EAFNOSUPPORT);
#endif
#if defined(EADDRINUSE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EaddrinuseExc> (EADDRINUSE);
#endif
#if defined(EADDRNOTAVAIL)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EaddrnotavailExc> (EADDRNOTAVAIL);
#endif
#if defined(ENETDOWN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnetdownExc> (ENETDOWN);
#endif
#if defined(ENETUNREACH)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnetunreachExc> (ENETUNREACH);
#endif
#if defined(ENETRESET)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnetresetExc> (ENETRESET);
#endif
#if defined(ECONNABORTED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EconnabortedExc> (ECONNABORTED);
#endif
#if defined(ECONNRESET)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EconnresetExc> (ECONNRESET);
#endif
#if defined(ENOBUFS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnobufsExc> (ENOBUFS);
#endif
#if defined(EISCONN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EisconnExc> (EISCONN);
#endif
#if defined(ENOTCONN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotconnExc> (ENOTCONN);
#endif
#if defined(ESHUTDOWN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EshutdownExc> (ESHUTDOWN);
#endif
#if defined(ETOOMANYREFS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EtoomanyrefsExc> (ETOOMANYREFS);
#endif
#if defined(ETIMEDOUT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EtimedoutExc> (ETIMEDOUT);
#endif
#if defined(ECONNREFUSED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EconnrefusedExc> (ECONNREFUSED);
#endif
#if defined(EHOSTDOWN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EhostdownExc> (EHOSTDOWN);
#endif
#if defined(EHOSTUNREACH)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EhostunreachExc> (EHOSTUNREACH);
#endif
#if defined(EALREADY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EalreadyExc> (EALREADY);
#endif
#if defined(EINPROGRESS)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinprogressExc> (EINPROGRESS);
#endif
#if defined(ESTALE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EstaleExc> (ESTALE);
#endif
#if defined(EIORESID)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EioresidExc> (EIORESID);
#endif
#if defined(EUCLEAN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EucleanExc> (EUCLEAN);
#endif
#if defined(ENOTNAM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotnamExc> (ENOTNAM);
#endif
#if defined(ENAVAIL)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnavailExc> (ENAVAIL);
#endif
#if defined(EISNAM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EisnamExc> (EISNAM);
#endif
#if defined(EREMOTEIO)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EremoteioExc> (EREMOTEIO);
#endif
#if defined(EINIT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinitExc> (EINIT);
#endif
#if defined(EREMDEV)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EremdevExc> (EREMDEV);
#endif
#if defined(ECANCELED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EcanceledExc> (ECANCELED);
#endif
#if defined(ENOLIMFILE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnolimfileExc> (ENOLIMFILE);
#endif
#if defined(EPROCLIM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EproclimExc> (EPROCLIM);
#endif
#if defined(EDISJOINT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdisjointExc> (EDISJOINT);
#endif
#if defined(ENOLOGIN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnologinExc> (ENOLOGIN);
#endif
#if defined(ELOGINLIM)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EloginlimExc> (ELOGINLIM);
#endif
#if defined(EGROUPLOOP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EgrouploopExc> (EGROUPLOOP);
#endif
#if defined(ENOATTACH)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoattachExc> (ENOATTACH);
#endif
#if defined(ENOTSUP) && defined(EOPNOTSUPP)
#    if ENOTSUP != EOPNOTSUPP
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotsupExc> (ENOTSUP);
#    endif
#elif defined(ENOTSUP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotsupExc> (ENOTSUP);
#endif
#if defined(ENOATTR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoattrExc> (ENOATTR);
#endif
#if defined(EDIRCORRUPTED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdircorruptedExc> (EDIRCORRUPTED);
#endif
#if defined(EDQUOT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdquotExc> (EDQUOT);
#endif
#if defined(ENFSREMOTE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnfsremoteExc> (ENFSREMOTE);
#endif
#if defined(ECONTROLLER)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EcontrollerExc> (ECONTROLLER);
#endif
#if defined(ENOTCONTROLLER)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotcontrollerExc> (
        ENOTCONTROLLER);
#endif
#if defined(EENQUEUED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EenqueuedExc> (EENQUEUED);
#endif
#if defined(ENOTENQUEUED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotenqueuedExc> (ENOTENQUEUED);
#endif
#if defined(EJOINED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EjoinedExc> (EJOINED);
#endif
#if defined(ENOTJOINED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotjoinedExc> (ENOTJOINED);
#endif
#if defined(ENOPROC)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoprocExc> (ENOPROC);
#endif
#if defined(EMUSTRUN)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EmustrunExc> (EMUSTRUN);
#endif
#if defined(ENOTSTOPPED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnotstoppedExc> (ENOTSTOPPED);
#endif
#if defined(ECLOCKCPU)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EclockcpuExc> (ECLOCKCPU);
#endif
#if defined(EINVALSTATE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinvalstateExc> (EINVALSTATE);
#endif
#if defined(ENOEXIST)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnoexistExc> (ENOEXIST);
#endif
#if defined(EENDOFMINOR)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EendofminorExc> (EENDOFMINOR);
#endif
#if defined(EBUFSIZE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EbufsizeExc> (EBUFSIZE);
#endif
#if defined(EEMPTY)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EemptyExc> (EEMPTY);
#endif
#if defined(ENOINTRGROUP)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EnointrgroupExc> (ENOINTRGROUP);
#endif
#if defined(EINVALMODE)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinvalmodeExc> (EINVALMODE);
#endif
#if defined(ECANTEXTENT)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EcantextentExc> (ECANTEXTENT);
#endif
#if defined(EINVALTIME)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EinvaltimeExc> (EINVALTIME);
#endif
#if defined(EDESTROYED)
    testThrowErrnoExc<IEX_INTERNAL_NAMESPACE::EdestroyedExc> (EDESTROYED);
#endif
}